

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O1

void glist_delete(_glist *x,t_gobj *y)

{
  t_editor *ptVar1;
  t_editor *ptVar2;
  ushort uVar3;
  t_gobj *ptVar4;
  int iVar5;
  int iVar6;
  t_symbol *ptVar7;
  t_gotfn p_Var8;
  _glist *x_00;
  char *tag_00;
  t_template *ptVar9;
  t_object *who;
  _rtext *p_Var10;
  t_gobj **pptVar11;
  _glist *p_Var12;
  t_gobj *ptVar13;
  _glist *p_Var14;
  _glist *gl;
  char tag [80];
  char local_88 [88];
  
  ptVar7 = gensym("dsp");
  p_Var8 = zgetfn(&y->g_pd,ptVar7);
  p_Var14 = x;
  do {
    x_00 = p_Var14;
    if (x_00->gl_owner == (_glist *)0x0) break;
    p_Var14 = x_00->gl_owner;
  } while ((*(ushort *)&x_00->field_0xe8 & 0x901) == 0x100);
  iVar5 = class_isdrawcommand(y->g_pd);
  if (y->g_pd == canvas_class) {
    canvas_closebang((_glist *)y);
  }
  uVar3 = (ushort)*(undefined4 *)&x_00->field_0xe8;
  *(ushort *)&x_00->field_0xe8 = uVar3 | 0x40;
  ptVar1 = x->gl_editor;
  if (ptVar1 != (t_editor *)0x0) {
    ptVar2 = x_00->gl_editor;
    if ((ptVar2 != (t_editor *)0x0) && (ptVar2->e_grab == y)) {
      ptVar2->e_grab = (t_gobj *)0x0;
    }
    if (ptVar1->e_grab == y) {
      ptVar1->e_grab = (t_gobj *)0x0;
    }
    iVar6 = glist_isselected(x,y);
    if (iVar6 != 0) {
      glist_deselect(x,y);
    }
    if (y->g_pd == canvas_class) {
      if ((((ulong)y[0xe].g_next & 0x100) == 0) || (iVar6 = glist_isvisible(x), iVar6 == 0)) {
        iVar6 = glist_isvisible(x);
        if (iVar6 != 0) {
          p_Var10 = glist_findrtext(x,(t_text *)y);
          tag_00 = rtext_gettag(p_Var10);
          text_eraseborder((t_text *)y,x,tag_00);
        }
      }
      else {
        sprintf(local_88,"graph%lx",y);
        glist_eraseiofor(x,(t_object *)y,local_88);
      }
    }
  }
  p_Var14 = x;
  if (iVar5 != 0) {
    do {
      p_Var12 = p_Var14;
      if (p_Var12->gl_owner == (_glist *)0x0) break;
      p_Var14 = p_Var12->gl_owner;
    } while ((*(ushort *)&p_Var12->field_0xe8 & 0x901) == 0x100);
    ptVar7 = canvas_makebindsym(p_Var12->gl_name);
    ptVar9 = template_findbyname(ptVar7);
    canvas_redrawallfortemplate(ptVar9,2);
  }
  gobj_delete(y,x);
  iVar6 = glist_isvisible(x_00);
  if (iVar6 != 0) {
    gobj_vis(y,x,0);
  }
  if ((x->gl_editor == (t_editor *)0x0) || (who = pd_checkobject(&y->g_pd), who == (t_object *)0x0))
  {
    p_Var10 = (_rtext *)0x0;
  }
  else {
    p_Var10 = glist_findrtext(x,who);
    if (p_Var10 == (_rtext *)0x0) {
      p_Var10 = rtext_new(x,who);
    }
  }
  ptVar4 = x->gl_list;
  if (x->gl_list == y) {
    pptVar11 = &x->gl_list;
  }
  else {
    do {
      ptVar13 = ptVar4;
      if (ptVar13 == (t_gobj *)0x0) goto LAB_001487c2;
      ptVar4 = ptVar13->g_next;
    } while (ptVar13->g_next != y);
    pptVar11 = &ptVar13->g_next;
  }
  *pptVar11 = y->g_next;
LAB_001487c2:
  if (y->g_pd == scalar_class) {
    glist_valid = glist_valid + 1;
    x->gl_valid = glist_valid;
  }
  pd_free(&y->g_pd);
  if (p_Var10 != (_rtext *)0x0) {
    rtext_free(p_Var10);
  }
  if (p_Var8 != (t_gotfn)0x0) {
    canvas_update_dsp();
  }
  if (iVar5 != 0) {
    do {
      p_Var14 = x;
      if (p_Var14->gl_owner == (_glist *)0x0) break;
      x = p_Var14->gl_owner;
    } while ((*(ushort *)&p_Var14->field_0xe8 & 0x901) == 0x100);
    ptVar7 = canvas_makebindsym(p_Var14->gl_name);
    ptVar9 = template_findbyname(ptVar7);
    canvas_redrawallfortemplate(ptVar9,1);
  }
  *(ushort *)&x_00->field_0xe8 = (ushort)*(undefined4 *)&x_00->field_0xe8 & 0xffbf | uVar3 & 0x40;
  return;
}

Assistant:

void glist_delete(t_glist *x, t_gobj *y)
{
    t_gobj *g;
    t_object *ob;
    t_gotfn chkdsp = zgetfn(&y->g_pd, gensym("dsp"));
    t_canvas *canvas = glist_getcanvas(x);
    t_rtext *rtext = 0;
    int drawcommand = class_isdrawcommand(y->g_pd);
    int wasdeleting;

    if (pd_class(&y->g_pd) == canvas_class) {
            /* JMZ: send a closebang to the canvas */
        canvas_closebang((t_canvas *)y);
    }

    wasdeleting = canvas_setdeleting(canvas, 1);
    if (x->gl_editor)
    {
            /* if we've grabbed events from canvas release them */
        if (canvas->gl_editor && canvas->gl_editor->e_grab == y)
            canvas->gl_editor->e_grab = 0;
                /* perhaps we grabbed our own glist instead? don't know if
                this ever happens: */
        if (x->gl_editor->e_grab == y)
            x->gl_editor->e_grab = 0;
        if (glist_isselected(x, y)) glist_deselect(x, y);

            /* HACK -- we had phantom outlets not getting erased on the
            screen because the canvas_setdeleting() mechanism is too
            crude.  LATER carefully set up rules for when the rtexts
            should exist, so that they stay around until all the
            steps of becoming invisible are done.  In the meantime, just
            zap the inlets and outlets here... */
        if (pd_class(&y->g_pd) == canvas_class)
        {
            t_glist *gl = (t_glist *)y;
            if (gl->gl_isgraph && glist_isvisible(x))
            {
                char tag[80];
                sprintf(tag, "graph%lx", (t_int)gl);
                glist_eraseiofor(x, &gl->gl_obj, tag);
            }
            else
            {
                if (glist_isvisible(x))
                    text_eraseborder(&gl->gl_obj, x,
                        rtext_gettag(glist_findrtext(x, &gl->gl_obj)));
            }
        }
    }
        /* if we're a drawing command, erase all scalars now, before deleting
        it; we'll redraw them once it's deleted below. */
    if (drawcommand)
        canvas_redrawallfortemplate(template_findbyname(canvas_makebindsym(
            glist_getcanvas(x)->gl_name)), 2);
    gobj_delete(y, x);
    if (glist_isvisible(canvas))
    {
        gobj_vis(y, x, 0);
    }
    if (x->gl_editor && (ob = pd_checkobject(&y->g_pd)) &&
        !(rtext = glist_findrtext(x, ob)))
            rtext = rtext_new(x, ob);
    if (x->gl_list == y) x->gl_list = y->g_next;
    else for (g = x->gl_list; g; g = g->g_next)
        if (g->g_next == y)
    {
        g->g_next = y->g_next;
        break;
    }
    if (y->g_pd == scalar_class)
        x->gl_valid = ++glist_valid;
    pd_free(&y->g_pd);
    if (rtext)
        rtext_free(rtext);
    if (chkdsp) canvas_update_dsp();
    if (drawcommand)
        canvas_redrawallfortemplate(template_findbyname(canvas_makebindsym(
            glist_getcanvas(x)->gl_name)), 1);
    canvas_setdeleting(canvas, wasdeleting);
}